

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *pWVar1;
  ushort uVar2;
  ushort uVar3;
  word *pwVar4;
  Arena *pAVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int nestingLimit_00;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  WirePointer *pWVar16;
  ulong uVar17;
  WirePointer *pWVar18;
  MessageSizeCounts MVar19;
  Fault f;
  Fault local_38;
  
  uVar9 = (ref->offsetAndKind).value;
  uVar11 = 0;
  if ((ref->field_1).upper32Bits != 0 || uVar9 != 0) {
    if (nestingLimit < 1) {
      totalSize();
    }
    else {
      nestingLimit_00 = nestingLimit + -1;
      pWVar16 = ref + 1;
      lVar10 = (long)((int)uVar9 >> 2);
      if (segment == (SegmentReader *)0x0) {
        pWVar18 = pWVar16 + lVar10;
        segment = (SegmentReader *)0x0;
        switch(uVar9 & 3) {
        case 0:
switchD_001fecfc_caseD_0:
          uVar17 = (ulong)(ref->field_1).structRef.dataSize.value;
          uVar12 = (ulong)(ref->field_1).structRef.ptrCount.value;
          if (segment == (SegmentReader *)0x0) {
LAB_001feed4:
            uVar14 = uVar17 + uVar12;
            if (uVar12 != 0) {
              pWVar18 = pWVar18 + uVar17;
              uVar11 = 0;
              do {
                MVar19 = totalSize(segment,pWVar18,nestingLimit_00);
                uVar14 = uVar14 + MVar19.wordCount;
                uVar11 = uVar11 + MVar19.capCount;
                pWVar18 = pWVar18 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            goto LAB_001ff09c;
          }
          uVar14 = uVar17 + uVar12;
          if (((long)pWVar18 - (long)(segment->ptr).ptr >> 3) + uVar14 <= (segment->ptr).size_) {
            uVar6 = segment->readLimiter->limit;
            if (uVar14 <= uVar6) {
              segment->readLimiter->limit = uVar6 - uVar14;
              goto LAB_001feed4;
            }
            (*segment->arena->_vptr_Arena[3])();
          }
          totalSize();
          break;
        case 1:
switchD_001fecfc_caseD_1:
          uVar9 = (ref->field_1).upper32Bits;
          uVar13 = uVar9 & 7;
          uVar14 = (ulong)uVar13;
          switch(uVar13) {
          case 0:
            uVar11 = uVar13;
            goto LAB_001ff09c;
          default:
            uVar14 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + uVar14 * 4) * (ulong)(uVar9 >> 3) +
                     0x3f >> 6;
            if (segment == (SegmentReader *)0x0) goto LAB_001ff09c;
            uVar17 = uVar14 & 0xffffffff;
            if (((long)pWVar18 - (long)(segment->ptr).ptr >> 3) + uVar17 <= (segment->ptr).size_) {
              uVar12 = segment->readLimiter->limit;
              if (uVar17 <= uVar12) {
                segment->readLimiter->limit = uVar12 - uVar17;
                goto LAB_001ff09c;
              }
              (*segment->arena->_vptr_Arena[3])();
            }
            totalSize();
            break;
          case 6:
            if (segment == (SegmentReader *)0x0) {
LAB_001ff02a:
              uVar14 = (ulong)(uVar9 >> 3);
              if (7 < uVar9) {
                uVar11 = 0;
                uVar17 = uVar14;
                do {
                  MVar19 = totalSize(segment,pWVar18,nestingLimit_00);
                  uVar14 = uVar14 + MVar19.wordCount;
                  uVar11 = uVar11 + MVar19.capCount;
                  pWVar18 = pWVar18 + 1;
                  uVar17 = uVar17 - 1;
                } while (uVar17 != 0);
              }
              goto LAB_001ff09c;
            }
            uVar14 = (ulong)(uVar9 >> 3);
            if (((long)pWVar18 - (long)(segment->ptr).ptr >> 3) + uVar14 <= (segment->ptr).size_) {
              uVar17 = segment->readLimiter->limit;
              if (uVar14 <= uVar17) {
                segment->readLimiter->limit = uVar17 - uVar14;
                goto LAB_001ff02a;
              }
              (*segment->arena->_vptr_Arena[3])();
            }
            totalSize();
            break;
          case 7:
            uVar17 = (ulong)(uVar9 >> 3);
            if (segment == (SegmentReader *)0x0) {
LAB_001fef42:
              uVar9 = (pWVar18->offsetAndKind).value;
              if ((uVar9 & 3) == 0) {
                uVar9 = uVar9 >> 2 & 0x1fffffff;
                uVar2 = *(ushort *)&pWVar18->field_1;
                uVar3 = (pWVar18->field_1).structRef.ptrCount.value;
                uVar14 = ((ulong)uVar3 + (ulong)uVar2) * (ulong)uVar9;
                if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
                  uVar14 = uVar14 + 1;
                  if ((uVar3 != 0) && (uVar9 != 0)) {
                    uVar11 = 0;
                    uVar13 = 0;
                    do {
                      pWVar18 = pWVar18 + uVar2;
                      uVar17 = (ulong)uVar3;
                      do {
                        pWVar18 = pWVar18 + 1;
                        MVar19 = totalSize(segment,pWVar18,nestingLimit_00);
                        uVar14 = uVar14 + MVar19.wordCount;
                        uVar11 = uVar11 + MVar19.capCount;
                        uVar15 = (int)uVar17 - 1;
                        uVar17 = (ulong)uVar15;
                      } while (uVar15 != 0);
                      uVar13 = uVar13 + 1;
                    } while (uVar13 != uVar9);
                  }
                  goto LAB_001ff09c;
                }
                totalSize();
              }
              else {
                totalSize();
              }
            }
            else {
              if (((long)pWVar18 - (long)(segment->ptr).ptr >> 3) + uVar17 + 1 <=
                  (segment->ptr).size_) {
                uVar14 = segment->readLimiter->limit;
                if (uVar17 + 1 <= uVar14) {
                  segment->readLimiter->limit = uVar14 - (uVar17 + 1);
                  goto LAB_001fef42;
                }
                (*segment->arena->_vptr_Arena[3])();
              }
              totalSize();
            }
          }
          break;
        case 2:
switchD_001fecfc_caseD_2:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x36f,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          kj::_::Debug::Fault::~Fault(&local_38);
          break;
        case 3:
switchD_001fecfc_caseD_3:
          uVar14 = 0;
          if (uVar9 == 3) {
            uVar11 = 1;
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x377,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                       (char (*) [22])"Unknown pointer type.");
            kj::_::Debug::Fault::~Fault(&local_38);
            uVar11 = 0;
          }
          goto LAB_001ff09c;
        }
      }
      else {
        pwVar4 = (segment->ptr).ptr;
        pWVar1 = (WirePointer *)(pwVar4 + (segment->ptr).size_);
        pWVar18 = pWVar16 + lVar10;
        if ((long)pWVar1 - (long)pWVar16 >> 3 < lVar10) {
          pWVar18 = pWVar1;
        }
        if (lVar10 < (long)pwVar4 - (long)pWVar16 >> 3) {
          pWVar18 = pWVar1;
        }
        if ((uVar9 & 3) == 2) {
          iVar8 = (*segment->arena->_vptr_Arena[2])();
          segment = (SegmentReader *)CONCAT44(extraout_var,iVar8);
          if (segment == (SegmentReader *)0x0) {
            totalSize();
          }
          else {
            uVar14 = (segment->ptr).size_;
            uVar9 = (ref->offsetAndKind).value;
            uVar17 = (ulong)(uVar9 >> 3);
            if ((long)uVar14 < (long)(ulong)(uVar9 >> 3)) {
              uVar17 = uVar14;
            }
            uVar12 = 2 - (ulong)((uVar9 & 4) == 0);
            if (uVar17 + uVar12 <= uVar14) {
              pwVar4 = (segment->ptr).ptr;
              pAVar5 = segment->arena;
              uVar6 = segment->readLimiter->limit;
              if (uVar12 <= uVar6) {
                pWVar16 = (WirePointer *)(pwVar4 + uVar17);
                ref = pWVar16 + 1;
                segment->readLimiter->limit = uVar6 - uVar12;
                if ((uVar9 & 4) == 0) {
                  uVar9 = (pWVar16->offsetAndKind).value;
                  lVar10 = (long)((int)uVar9 >> 2);
                  pWVar18 = (WirePointer *)(pwVar4 + uVar14);
                  if (((long)pwVar4 - (long)ref >> 3 <= lVar10) &&
                     (lVar10 <= (long)pWVar18 - (long)ref >> 3)) {
                    pWVar18 = ref + lVar10;
                    ref = pWVar16;
                    switch(uVar9 & 3) {
                    case 1:
                      goto switchD_001fecfc_caseD_1;
                    case 2:
                      goto switchD_001fecfc_caseD_2;
                    case 3:
                      goto switchD_001fecfc_caseD_3;
                    }
                    goto switchD_001fecfc_caseD_0;
                  }
                  goto LAB_001fed69;
                }
                iVar8 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)(pWVar16->field_1).upper32Bits);
                segment = (SegmentReader *)CONCAT44(extraout_var_00,iVar8);
                if (segment == (SegmentReader *)0x0) {
                  totalSize();
                }
                else {
                  uVar9 = (pWVar16->offsetAndKind).value;
                  if ((uVar9 & 3) == 2) {
                    uVar14 = (ulong)(uVar9 >> 3);
                    sVar7 = (segment->ptr).size_;
                    if ((long)sVar7 < (long)uVar14) {
                      uVar14 = sVar7;
                    }
                    pWVar18 = (WirePointer *)((segment->ptr).ptr + uVar14);
                    goto LAB_001fed5d;
                  }
                  totalSize();
                }
                goto LAB_001ff099;
              }
              (*pAVar5->_vptr_Arena[3])();
            }
            totalSize();
          }
        }
        else {
LAB_001fed5d:
          pWVar16 = ref;
          if (pWVar18 != (WirePointer *)0x0) {
LAB_001fed69:
            uVar9 = (pWVar16->offsetAndKind).value;
            ref = pWVar16;
            switch(uVar9 & 3) {
            case 1:
              goto switchD_001fecfc_caseD_1;
            case 2:
              goto switchD_001fecfc_caseD_2;
            case 3:
              goto switchD_001fecfc_caseD_3;
            }
            goto switchD_001fecfc_caseD_0;
          }
        }
      }
    }
  }
LAB_001ff099:
  uVar14 = 0;
  uVar11 = 0;
LAB_001ff09c:
  MVar19.capCount = uVar11;
  MVar19.wordCount = uVar14;
  MVar19._12_4_ = 0;
  return MVar19;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_MAYBE(p, followFars(ref, ref->target(segment), segment)) {
      ptr = p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size.") {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }